

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlReadMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int size_local;
  char *buffer_local;
  
  xmlInitParser();
  ctxt_00 = xmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)xmlDoRead(ctxt_00,URL,encoding,options,0);
  }
  return (xmlDocPtr)buffer_local;
}

Assistant:

xmlDocPtr
xmlReadMemory(const char *buffer, int size, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;

    xmlInitParser();
    ctxt = xmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL)
        return (NULL);
    return (xmlDoRead(ctxt, URL, encoding, options, 0));
}